

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O2

int CfdCloneHandle(void *source,void **handle)

{
  void *destination;
  int iVar1;
  undefined1 *this;
  
  if (handle == (void **)0x0) {
    iVar1 = 1;
  }
  else {
    cfd::Initialize();
    this = cfd::capi::capi_instance;
    destination = cfd::capi::CfdCapiManager::CreateHandle
                            ((CfdCapiManager *)cfd::capi::capi_instance,true);
    if (source != (void *)0x0) {
      cfd::capi::CfdCapiManager::CopyHandle((CfdCapiManager *)this,source,destination,true);
    }
    *handle = destination;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CfdCloneHandle(void* source, void** handle) {
  int result = kCfdUnknownError;
  void* temp_handle = nullptr;
  try {
    if (handle == nullptr) return kCfdIllegalArgumentError;
    cfd::Initialize();
    temp_handle = cfd::capi::capi_instance.CreateHandle(true);

    if (source != nullptr) {
      cfd::capi::capi_instance.CopyHandle(source, temp_handle);
    }
    *handle = temp_handle;
    return kCfdSuccess;
  } catch (const CfdException& except) {
    result = except.GetErrorCode();
  } catch (...) {
    // do nothing
  }
  CfdFreeHandle(temp_handle);
  return result;
}